

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::testGroupEnded(JunitReporter *this,TestGroupStats *testGroupStats)

{
  uint64_t uVar1;
  long lVar2;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar1 = (this->suiteTimer).m_nanoseconds;
  CumulativeReporterBase<Catch::JunitReporter>::testGroupEnded
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,testGroupStats);
  writeGroup(this,(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_testGroups.
                  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(double)((lVar2 - uVar1) / 1000) / 1000000.0);
  return;
}

Assistant:

void JunitReporter::testGroupEnded( TestGroupStats const& testGroupStats ) {
        double suiteTime = suiteTimer.getElapsedSeconds();
        CumulativeReporterBase::testGroupEnded( testGroupStats );
        writeGroup( *m_testGroups.back(), suiteTime );
    }